

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O1

void Imf_3_4::anon_unknown_0::interleave_scalar(char *source,size_t outSize,char *out)

{
  char *pcVar1;
  char *pcVar2;
  char *s;
  char *t1;
  
  if (0 < (long)outSize) {
    pcVar1 = out + outSize;
    do {
      *out = *source;
      if (pcVar1 <= out + 1) {
        return;
      }
      pcVar2 = source + (outSize + 1 >> 1);
      source = source + 1;
      out[1] = *pcVar2;
      out = out + 2;
    } while (out < pcVar1);
  }
  return;
}

Assistant:

void
interleave_scalar (const char* source, size_t outSize, char* out)
{
    const char* t1   = source;
    const char* t2   = source + (outSize + 1) / 2;
    char*       s    = out;
    char* const stop = s + outSize;

    while (true)
    {
        if (s < stop)
            *(s++) = *(t1++);
        else
            break;

        if (s < stop)
            *(s++) = *(t2++);
        else
            break;
    }
}